

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::successOrFailColoredStringToStream
          (ConsoleReporter *this,bool success,Enum at,char *success_str)

{
  ostream *poVar1;
  int iVar2;
  Enum code;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000031,success);
  poVar1 = this->s;
  code = BrightGreen;
  if (iVar2 == 0) {
    code = (at & is_warn) * 4 + Red;
  }
  Color::operator<<(poVar1,code);
  if (iVar2 == 0) {
    pcVar3 = failureString(at);
  }
  else {
    pcVar3 = "SUCCESS";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

void successOrFailColoredStringToStream(bool success, assertType::Enum at,
                                                const char* success_str = "SUCCESS") {
            s << getSuccessOrFailColor(success, at)
              << getSuccessOrFailString(success, at, success_str) << ": ";
        }